

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O1

ON_Object * CreateNewON_RevSurface(void)

{
  ON_RevSurface *this;
  
  this = (ON_RevSurface *)operator_new(0xa0);
  ON_RevSurface::ON_RevSurface(this);
  return (ON_Object *)this;
}

Assistant:

void ON_RevSurface::DestroyRuntimeCache( bool bDelete )
{
  ON_Surface::DestroyRuntimeCache(bDelete);
  if ( 0 != m_curve )
    m_curve->DestroyRuntimeCache(bDelete);
  // 15 August 2003 Dale Lear
  //    Added the call to destroy m_bbox.
  m_bbox.Destroy();
}